

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Graph_t * Kit_TruthToGraph(uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  int fCompl;
  int iVar1;
  int RetValue;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth_local;
  
  fCompl = Kit_TruthIsop(pTruth,nVars,vMemory,1);
  if (fCompl == -1) {
    pTruth_local = (uint *)0x0;
  }
  else {
    iVar1 = Vec_IntSize(vMemory);
    if (iVar1 < 0x10001) {
      if ((fCompl != 0) && (fCompl != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitGraph.c"
                      ,0x16e,"Kit_Graph_t *Kit_TruthToGraph(unsigned int *, int, Vec_Int_t *)");
      }
      pTruth_local = (uint *)Kit_SopFactor(vMemory,fCompl,nVars,vMemory);
    }
    else {
      pTruth_local = (uint *)0x0;
    }
  }
  return (Kit_Graph_t *)pTruth_local;
}

Assistant:

Kit_Graph_t * Kit_TruthToGraph( unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph;
    int RetValue;
    // derive SOP
    RetValue = Kit_TruthIsop( pTruth, nVars, vMemory, 1 ); // tried 1 and found not useful in "renode"
    if ( RetValue == -1 )
        return NULL;
    if ( Vec_IntSize(vMemory) > (1<<16) )
        return NULL;
//    printf( "Isop size = %d.\n", Vec_IntSize(vMemory) );
    assert( RetValue == 0 || RetValue == 1 );
    // derive factored form
    pGraph = Kit_SopFactor( vMemory, RetValue, nVars, vMemory );
    return pGraph;
}